

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>::
runOnFunction(WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>
              *this,Module *module,Function *func)

{
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    (this->super_PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>).
    super_Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>.currModule = module;
    (this->super_PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>).
    super_Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>.currFunction = func;
    Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::walk
              (&(this->super_PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>).
                super_Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>,&func->body);
    ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::
    equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)
    ::LocalizerPass::visitFunction(wasm::Function__(this,func);
    (this->super_PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>).
    super_Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>.currFunction = (Function *)0x0;
    (this->super_PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>).
    super_Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>.currModule = (Module *)0x0;
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x223,
                "virtual void wasm::WalkerPass<wasm::PostWalker<LocalizerPass>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<LocalizerPass>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }